

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

HRESULT __thiscall Js::ScriptContext::OnDebuggerDetached(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  HRESULT hr_00;
  uint uVar3;
  ThreadContext *this_00;
  DebugManager *pDVar4;
  DebugContext *pDVar5;
  undefined4 *puVar6;
  AutoNestedHandledExceptionType local_64;
  uint uStack_60;
  OutOfMemoryException anon_var_0;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  HRESULT hrEntryPointUpdate;
  AutoDisableInterrupt autoDisableInterrupt;
  undefined1 local_30 [4];
  HRESULT hr;
  OldCodeGenAutoDelete autoDelete;
  StepController *stepController;
  ScriptContext *this_local;
  
  Output::Trace(DebuggerPhase,L"ScriptContext::OnDebuggerDetached: start 0x%p\n");
  this_00 = GetThreadContext(this);
  pDVar4 = ThreadContext::GetDebugManager(this_00);
  autoDelete.sc = (ScriptContext *)&pDVar4->stepController;
  bVar2 = StepController::IsActive((StepController *)autoDelete.sc);
  if (bVar2) {
    StepController::Deactivate((StepController *)autoDelete.sc,(InterpreterHaltState *)0x0);
  }
  OldCodeGenAutoDelete::OldCodeGenAutoDelete((OldCodeGenAutoDelete *)local_30,this);
  hr_00 = OnDebuggerAttachedDetached(this,false,(NativeCodeGenerator **)local_30);
  if (hr_00 != 0) {
    Debugger_AttachDetach_unrecoverable_error(hr_00);
  }
  pDVar5 = GetDebugContext(this);
  DebugContext::SetDebuggerMode(pDVar5,SourceRundown);
  AutoDisableInterrupt::AutoDisableInterrupt
            ((AutoDisableInterrupt *)&hrEntryPointUpdate,this->threadContext,false);
  pDVar5 = GetDebugContext(this);
  this_local._4_4_ = DebugContext::RundownSourcesAndReparse(pDVar5,false,true);
  uVar3 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
  if ((uVar3 & 1) == 0) {
    if (this_local._4_4_ != 0) {
      Debugger_AttachDetach_unrecoverable_error(this_local._4_4_);
    }
    uStack_60 = 0;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (&local_64,ExceptionType_OutOfMemory);
    UpdateRecyclerFunctionEntryPointsForDebugger(this);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_64);
    if (uStack_60 == 0) {
      Output::Trace(DebuggerPhase,L"ScriptContext::OnDebuggerDetached: done 0x%p, hr = 0x%X\n",this,
                    (ulong)this_local._4_4_);
    }
    else {
      if (uStack_60 != 0x8007000e) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0xee5,"(hrEntryPointUpdate == ((HRESULT)0x8007000EL))",
                                    "hrEntryPointUpdate == E_OUTOFMEMORY");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_local._4_4_ = uStack_60;
    }
  }
  AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)&hrEntryPointUpdate);
  OldCodeGenAutoDelete::~OldCodeGenAutoDelete((OldCodeGenAutoDelete *)local_30);
  return this_local._4_4_;
}

Assistant:

HRESULT ScriptContext::OnDebuggerDetached()
    {
        OUTPUT_TRACE(Js::DebuggerPhase, _u("ScriptContext::OnDebuggerDetached: start 0x%p\n"), this);

#if ENABLE_NATIVE_CODEGEN
#if PDATA_ENABLED && defined(_WIN32)
        // in case of debugger detaching, we have a new code generator and when deleting old code generator,
        // the xData is not put in the delay list yet. clear the list now so the code addresses are ready to reuse
        struct AutoReset
        {
            AutoReset(ThreadContext* threadContext)
                :threadContext(threadContext)
            {
                // indicate background thread that we need help to delete the xData
                threadContext->GetJobProcessor()->StartExtraWork();
            }
            ~AutoReset()
            {
                threadContext->GetJobProcessor()->EndExtraWork();
                // in case the background thread didn't clear all the function tables
                DelayDeletingFunctionTable::Clear();
            }

            ThreadContext* threadContext;
        } autoReset(this->GetThreadContext());
#endif
#endif

        Js::StepController* stepController = &this->GetThreadContext()->GetDebugManager()->stepController;
        if (stepController->IsActive())
        {
            // Normally step controller is deactivated on start of dispatch (step, async break, exception, etc),
            // and in the beginning of interpreter loop we check for step complete (can cause check whether current bytecode belong to stmt).
            // But since it holds to functionBody/statementMaps, we have to deactivate it as func bodies are going away/reparsed.
            stepController->Deactivate();
        }

        // Go through all existing functions and change their thunks back to using non-debug mode versions when called
        // and notify the script context that the debugger has detached to allow it to revert the runtime to the proper
        // state (JIT enabled).

#if ENABLE_NATIVE_CODEGEN
        OldCodeGenAutoDelete autoDelete(this);
        HRESULT hr = OnDebuggerAttachedDetached(/*attach*/ false, &(autoDelete.oldCodegen));
#else // ENABLE_NATIVE_CODEGEN
        HRESULT hr = OnDebuggerAttachedDetached(/*attach*/ false);
#endif

        // Debugger attach/detach failure is catastrophic, take down the process
        DEBUGGER_ATTACHDETACH_FATAL_ERROR_IF_FAILED(hr);

        // Move the debugger into source rundown mode.
        this->GetDebugContext()->SetDebuggerMode(Js::DebuggerMode::SourceRundown);

        // Disable QC while functions are re-parsed as this can be time consuming
        AutoDisableInterrupt autoDisableInterrupt(this->threadContext, false /* explicitCompletion */);

#if ENABLE_NATIVE_CODEGEN
#if PDATA_ENABLED && defined(_WIN32)
        // RundownSourcesAndReparse can cause code generation immediately, clear the leftovers if background thread didn't finish the work
        DelayDeletingFunctionTable::Clear();
#endif
#endif

        // Force a reparse so that indirect function caches are updated.
        hr = this->GetDebugContext()->RundownSourcesAndReparse(/*shouldPerformSourceRundown*/ false, /*shouldReparseFunctions*/ true);

        if (this->IsClosed())
        {
            return hr;
        }

        // Debugger attach/detach failure is catastrophic, take down the process
        DEBUGGER_ATTACHDETACH_FATAL_ERROR_IF_FAILED(hr);

        HRESULT hrEntryPointUpdate = S_OK;
        BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
        {
            // Still do the pass on the function's entrypoint to reflect its state with the functionbody's entrypoint.
            this->UpdateRecyclerFunctionEntryPointsForDebugger();
        }